

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

CK_RV __thiscall Token::loginUser(Token *this,ByteString *pin)

{
  undefined3 uVar1;
  bool bVar2;
  size_t sVar3;
  long in_RDI;
  MutexLocker lock;
  CK_ULONG flags;
  SecureDataManager *in_stack_ffffffffffffff68;
  undefined6 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff76;
  byte in_stack_ffffffffffffff77;
  undefined2 local_20;
  byte bStack_1e;
  undefined5 uStack_1d;
  CK_RV local_8;
  
  MutexLocker::MutexLocker
            ((MutexLocker *)
             CONCAT17(in_stack_ffffffffffffff77,
                      CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),
             (Mutex *)in_stack_ffffffffffffff68);
  if (*(long *)(in_RDI + 0x18) == 0) {
    local_8 = 5;
  }
  else {
    bVar2 = SecureDataManager::isSOLoggedIn(*(SecureDataManager **)(in_RDI + 0x18));
    if (bVar2) {
      local_8 = 0x104;
    }
    else {
      bVar2 = SecureDataManager::isUserLoggedIn(*(SecureDataManager **)(in_RDI + 0x18));
      if (bVar2) {
        local_8 = 0x100;
      }
      else {
        SecureDataManager::getUserPINBlob(in_stack_ffffffffffffff68);
        sVar3 = ByteString::size((ByteString *)0x1ed357);
        ByteString::~ByteString((ByteString *)0x1ed368);
        if (sVar3 == 0) {
          local_8 = 0x102;
        }
        else {
          in_stack_ffffffffffffff77 =
               (**(code **)(**(long **)(in_RDI + 0x10) + 0x20))(*(long **)(in_RDI + 0x10),&local_20)
          ;
          if ((in_stack_ffffffffffffff77 & 1) == 0) {
            softHSMLog(3,"loginUser",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/slot_mgr/Token.cpp"
                       ,0xab,"Could not get the token flags");
            local_8 = 5;
          }
          else {
            in_stack_ffffffffffffff76 =
                 SecureDataManager::loginUser
                           ((SecureDataManager *)
                            CONCAT17(in_stack_ffffffffffffff77,
                                     CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),
                            (ByteString *)in_stack_ffffffffffffff68);
            if ((bool)in_stack_ffffffffffffff76) {
              uVar1 = CONCAT12(bStack_1e,local_20);
              bStack_1e = bStack_1e & 0xfe;
              (**(code **)(**(long **)(in_RDI + 0x10) + 0x28))
                        (*(long **)(in_RDI + 0x10),CONCAT53(uStack_1d,uVar1) & 0xfffffffffffeffff);
              local_8 = 0;
            }
            else {
              uVar1 = CONCAT12(bStack_1e,local_20);
              bStack_1e = bStack_1e | 1;
              (**(code **)(**(long **)(in_RDI + 0x10) + 0x28))
                        (*(long **)(in_RDI + 0x10),CONCAT53(uStack_1d,uVar1) | 0x10000);
              local_8 = 0xa0;
            }
          }
        }
      }
    }
  }
  MutexLocker::~MutexLocker
            ((MutexLocker *)
             CONCAT17(in_stack_ffffffffffffff77,
                      CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)));
  return local_8;
}

Assistant:

CK_RV Token::loginUser(ByteString& pin)
{
	CK_ULONG flags;

	// Lock access to the token
	MutexLocker lock(tokenMutex);

	if (sdm == NULL) return CKR_GENERAL_ERROR;

	// SO cannot be logged in
	if (sdm->isSOLoggedIn()) return CKR_USER_ANOTHER_ALREADY_LOGGED_IN;

	// User cannot be logged in
	if (sdm->isUserLoggedIn()) return CKR_USER_ALREADY_LOGGED_IN;

	// The user PIN has to be initialized;
	if (sdm->getUserPINBlob().size() == 0) return CKR_USER_PIN_NOT_INITIALIZED;

	// Get token flags
	if (!token->getTokenFlags(flags))
	{
		ERROR_MSG("Could not get the token flags");
		return CKR_GENERAL_ERROR;
	}

	// Login
	if (!sdm->loginUser(pin))
	{
		flags |= CKF_USER_PIN_COUNT_LOW;
		token->setTokenFlags(flags);
		return CKR_PIN_INCORRECT;
	}

	flags &= ~CKF_USER_PIN_COUNT_LOW;
	token->setTokenFlags(flags);
	return CKR_OK;
}